

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O0

void dlib::
     matrix_assign_big<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::column_major_layout>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
               (matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>
                *dest,matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *src)

{
  matrix_assign_default<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::column_major_layout>,dlib::matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>
            (dest,src);
  return;
}

Assistant:

void matrix_assign_big (
        matrix_dest_type& dest,
        const matrix_exp<src_exp>& src
    )
    {
        matrix_assign_default(dest,src);
    }